

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O1

void __thiscall mbc::Val::MessageBook::save(MessageBook *this)

{
  int iVar1;
  undefined4 extraout_var;
  Ch *__s;
  size_t sVar2;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *local_288;
  ofstream out;
  ios_base local_190 [264];
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_88;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_50;
  
  local_50.os_ = &local_88;
  local_88.stack_.stack_ = (char *)0x0;
  local_88.stack_.stackTop_ = (char *)0x0;
  local_88.stack_.allocator_ = (CrtAllocator *)0x0;
  local_88.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_88.stack_.stackEnd_ = (char *)0x0;
  local_88.stack_.initialCapacity_ = 0x100;
  local_50.level_stack_.allocator_ = (CrtAllocator *)0x0;
  local_50.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_50.level_stack_.stack_ = (char *)0x0;
  local_50.level_stack_.stackTop_ = (char *)0x0;
  local_50.level_stack_.stackEnd_ = (char *)0x0;
  local_50.level_stack_.initialCapacity_ = 0x200;
  local_50.maxDecimalPlaces_ = 0x144;
  local_50.hasRoot_ = false;
  (*(this->super_ValBase)._vptr_ValBase[2])(&local_288,this);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  Accept<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
            (local_288,&local_50);
  if (_out != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_out);
  }
  iVar1 = (*(this->path_->super__ValAtom).super_ValBase._vptr_ValBase[4])();
  std::ofstream::ofstream(&local_288,(string *)CONCAT44(extraout_var,iVar1),_S_out);
  __s = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                  (&local_88);
  if (__s == (Ch *)0x0) {
    std::ios::clear((int)*(undefined8 *)(local_288 + -0x18) + (int)&stack0xfffffffffffffff8 +
                    0xfffffd80);
  }
  else {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_288,__s,sVar2);
  }
  local_288 = _VTT;
  *(undefined8 *)((long)&local_288 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&out);
  std::ios_base::~ios_base(local_190);
  free(local_50.level_stack_.stack_);
  if (local_50.level_stack_.ownAllocator_ != (CrtAllocator *)0x0) {
    operator_delete(local_50.level_stack_.ownAllocator_);
  }
  free(local_88.stack_.stack_);
  if (local_88.stack_.ownAllocator_ != (CrtAllocator *)0x0) {
    operator_delete(local_88.stack_.ownAllocator_);
  }
  return;
}

Assistant:

void MessageBook::save() {
    StringBuffer buffer;
    Writer<StringBuffer> writer(buffer);
    json_value() -> Accept(writer);

    ofstream out(path_ -> raw());
    out << buffer.GetString();
}